

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_28bf56::PulsePlayback::open(PulsePlayback *this,char *__file,int __oflag,...)

{
  PulseMainloop *this_00;
  ALCdevice *pAVar1;
  code *pcVar2;
  int iVar3;
  ALuint AVar4;
  int extraout_EAX;
  int iVar5;
  pa_context *ppVar6;
  pa_stream *ppVar7;
  undefined8 uVar8;
  pa_operation *op;
  backend_exception *this_01;
  long lVar9;
  int __oflag_00;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  pa_sample_spec local_74;
  unique_lock<std::mutex> plock;
  al local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  if (__file == (char *)0x0) {
    pcVar11 = (char *)0x0;
    uVar8 = (pointer)0x0;
    goto LAB_00168c11;
  }
  if ((anonymous_namespace)::PlaybackDevices == DAT_0022e5a8) {
    PulseMainloop::probePlaybackDevices(&this->mMainloop);
  }
  pcVar11 = DAT_0022e5a8;
  lVar10 = (long)DAT_0022e5a8 - (long)(anonymous_namespace)::PlaybackDevices;
  pcVar12 = (anonymous_namespace)::PlaybackDevices;
  if (0 < lVar10 >> 8) {
    lVar9 = (lVar10 >> 8) + 1;
    do {
      iVar3 = std::__cxx11::string::compare(pcVar12);
      pcVar13 = pcVar12;
      if (iVar3 == 0) goto LAB_00168bfb;
      iVar3 = std::__cxx11::string::compare(pcVar12 + 0x40);
      pcVar13 = pcVar12 + 0x40;
      if (iVar3 == 0) goto LAB_00168bfb;
      iVar3 = std::__cxx11::string::compare(pcVar12 + 0x80);
      pcVar13 = pcVar12 + 0x80;
      if (iVar3 == 0) goto LAB_00168bfb;
      iVar3 = std::__cxx11::string::compare(pcVar12 + 0xc0);
      pcVar13 = pcVar12 + 0xc0;
      if (iVar3 == 0) goto LAB_00168bfb;
      pcVar12 = pcVar12 + 0x100;
      lVar9 = lVar9 + -1;
      lVar10 = lVar10 + -0x100;
    } while (1 < lVar9);
  }
  lVar10 = lVar10 >> 6;
  if (lVar10 == 1) {
LAB_00168bd1:
    iVar3 = std::__cxx11::string::compare(pcVar12);
    pcVar13 = pcVar11;
    if (iVar3 == 0) {
      pcVar13 = pcVar12;
    }
  }
  else {
    pcVar13 = pcVar12;
    if (lVar10 == 2) {
LAB_00168bbe:
      iVar3 = std::__cxx11::string::compare(pcVar13);
      if (iVar3 != 0) {
        pcVar12 = pcVar13 + 0x40;
        goto LAB_00168bd1;
      }
    }
    else {
      pcVar13 = pcVar11;
      if ((lVar10 == 3) &&
         (iVar3 = std::__cxx11::string::compare(pcVar12), pcVar13 = pcVar12, iVar3 != 0)) {
        pcVar13 = pcVar12 + 0x40;
        goto LAB_00168bbe;
      }
    }
  }
LAB_00168bfb:
  if (pcVar13 == DAT_0022e5a8) {
    this_01 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_01,0xa004,"Device name \"%s\" not found",__file);
    __cxa_throw(this_01,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  pcVar11 = *(char **)pcVar13;
  uVar8 = *(undefined8 *)(pcVar13 + 0x20);
LAB_00168c11:
  this_00 = &this->mMainloop;
  plock._M_device = &(this->mMainloop).mMutex;
  plock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&plock);
  plock._M_owns = true;
  ppVar6 = PulseMainloop::connectContext(this_00,&plock);
  this->mContext = ppVar6;
  __oflag_00 = 0x1756da;
  iVar3 = GetConfigValueBool((char *)0x0,"pulse","allow-moves",1);
  local_74.format = PA_SAMPLE_S16LE;
  local_74.rate = 0xac44;
  local_74.channels = '\x02';
  local_74._9_3_ = 0;
  if ((pointer)uVar8 == (pointer)0x0) {
    if (((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                                     defname_abi_cxx11_), iVar5 != 0)) {
      al::getenv_abi_cxx11_(local_58,"ALSOFT_PULSE_DEFAULT");
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue = false;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
      _M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
      _M_string_length = 0;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._16_8_ = 0
      ;
      (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._24_8_ = 0
      ;
      if (local_58[0] == (al)0x1) {
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
        _M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.
                     field_1 + 0x10);
        if (local_50._M_p == (pointer)&local_40) {
          (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._28_4_
               = uStack_34;
          (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._24_4_
               = uStack_38;
        }
        else {
          (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue
          ._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_50._M_p;
        }
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._20_4_ =
             uStack_3c;
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1._16_4_ =
             local_40;
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.mValue.
        _M_string_length = local_48;
        (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue = true
        ;
      }
      __oflag_00 = 0x22e838;
      __cxa_atexit(al::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~optional,
                   &(anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::PulsePlayback::open(char_const*)::
                           defname_abi_cxx11_);
    }
    uVar8 = (anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.field_1.
            mValue._M_dataplus._M_p;
    if ((anonymous_namespace)::PulsePlayback::open(char_const*)::defname_abi_cxx11_.mHasValue ==
        false) {
      uVar8 = (pointer)0x0;
    }
  }
  if (2 < (int)gLogLevel) {
    _GLOBAL__N_1::PulsePlayback::open((char *)uVar8,__oflag_00);
  }
  ppVar7 = PulseMainloop::connectStream
                     (this_00,(char *)uVar8,&plock,this->mContext,
                      (uint)(iVar3 == 0) << 9 |
                      (PA_STREAM_FIX_CHANNELS|PA_STREAM_FIX_RATE|PA_STREAM_FIX_FORMAT|
                      PA_STREAM_START_CORKED),(pa_buffer_attr *)0x0,&local_74,(pa_channel_map *)0x0,
                      Playback);
  this->mStream = ppVar7;
  (*(anonymous_namespace)::ppa_stream_set_moved_callback)(ppVar7,streamMovedCallbackC,this);
  pcVar2 = (anonymous_namespace)::ppa_frame_size;
  uVar8 = (*(anonymous_namespace)::ppa_stream_get_sample_spec)(this->mStream);
  AVar4 = (*pcVar2)(uVar8);
  this->mFrameSize = AVar4;
  pcVar13 = (char *)(*(anonymous_namespace)::ppa_stream_get_device_name)(this->mStream);
  pcVar12 = (char *)(this->mDeviceName)._M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)&this->mDeviceName,0,pcVar12,(ulong)pcVar13);
  if (pcVar11 == (char *)0x0) {
    op = (pa_operation *)
         (*(anonymous_namespace)::ppa_context_get_sink_info_by_name)
                   (this->mContext,(this->mDeviceName)._M_dataplus._M_p,sinkNameCallbackC,this);
    PulseMainloop::waitForOperation(this_00,op,&plock);
  }
  else {
    pAVar1 = (this->super_BackendBase).mDevice;
    pcVar12 = (char *)(pAVar1->DeviceName)._M_string_length;
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&pAVar1->DeviceName,0,pcVar12,(ulong)pcVar11);
  }
  std::unique_lock<std::mutex>::~unique_lock(&plock);
  return extraout_EAX;
}

Assistant:

void PulsePlayback::open(const ALCchar *name)
{
    const char *pulse_name{nullptr};
    const char *dev_name{nullptr};

    if(name)
    {
        if(PlaybackDevices.empty())
            mMainloop.probePlaybackDevices();

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool { return entry.name == name; });
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        pulse_name = iter->device_name.c_str();
        dev_name = iter->name.c_str();
    }

    auto plock = mMainloop.getUniqueLock();
    mContext = mMainloop.connectContext(plock);

    pa_stream_flags_t flags{PA_STREAM_START_CORKED | PA_STREAM_FIX_FORMAT | PA_STREAM_FIX_RATE |
        PA_STREAM_FIX_CHANNELS};
    if(!GetConfigValueBool(nullptr, "pulse", "allow-moves", 1))
        flags |= PA_STREAM_DONT_MOVE;

    pa_sample_spec spec{};
    spec.format = PA_SAMPLE_S16NE;
    spec.rate = 44100;
    spec.channels = 2;

    if(!pulse_name)
    {
        static const auto defname = al::getenv("ALSOFT_PULSE_DEFAULT");
        if(defname) pulse_name = defname->c_str();
    }
    TRACE("Connecting to \"%s\"\n", pulse_name ? pulse_name : "(default)");
    mStream = mMainloop.connectStream(pulse_name, plock, mContext, flags, nullptr, &spec, nullptr,
        BackendType::Playback);

    pa_stream_set_moved_callback(mStream, &PulsePlayback::streamMovedCallbackC, this);
    mFrameSize = static_cast<ALuint>(pa_frame_size(pa_stream_get_sample_spec(mStream)));

    mDeviceName = pa_stream_get_device_name(mStream);
    if(!dev_name)
    {
        pa_operation *op{pa_context_get_sink_info_by_name(mContext, mDeviceName.c_str(),
            &PulsePlayback::sinkNameCallbackC, this)};
        mMainloop.waitForOperation(op, plock);
    }
    else
        mDevice->DeviceName = dev_name;
}